

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psnr.c
# Opt level: O0

int64_t encoder_highbd_sse(uint8_t *a8,int a_stride,uint8_t *b8,int b_stride,int w,int h)

{
  int diff;
  int j;
  int i;
  int64_t sse;
  uint16_t *b;
  uint16_t *a;
  int h_local;
  int w_local;
  int b_stride_local;
  uint8_t *b8_local;
  int a_stride_local;
  uint8_t *a8_local;
  
  a = (uint16_t *)((long)a8 << 1);
  b = (uint16_t *)((long)b8 << 1);
  sse = 0;
  for (i = 0; i < h; i = i + 1) {
    for (j = 0; j < w; j = j + 1) {
      sse = (int)(((uint)a[j] - (uint)b[j]) * ((uint)a[j] - (uint)b[j])) + sse;
    }
    a = a + a_stride;
    b = b + b_stride;
  }
  return sse;
}

Assistant:

static int64_t encoder_highbd_sse(const uint8_t *a8, int a_stride,
                                  const uint8_t *b8, int b_stride, int w,
                                  int h) {
  const uint16_t *a = CONVERT_TO_SHORTPTR(a8);
  const uint16_t *b = CONVERT_TO_SHORTPTR(b8);
  int64_t sse = 0;
  for (int i = 0; i < h; ++i) {
    for (int j = 0; j < w; ++j) {
      const int diff = a[j] - b[j];
      sse += diff * diff;
    }
    a += a_stride;
    b += b_stride;
  }
  return sse;
}